

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall asmjit::Assembler::embedLabel(Assembler *this,Label *label)

{
  byte bVar1;
  uint32_t sectionId;
  CodeHolder *this_00;
  Error EVar2;
  ulong uVar3;
  LabelLink *pLVar4;
  size_t offset;
  LabelEntry *le;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  RelocEntry *re;
  RelocEntry *local_30;
  
  EVar2 = (this->super_CodeEmitter)._lastError;
  if (EVar2 != 0) {
    return EVar2;
  }
  this_00 = (this->super_CodeEmitter)._code;
  if (this_00 == (CodeHolder *)0x0) {
    embedLabel();
  }
  else {
    uVar3 = (ulong)((label->super_Operand).super_Operand_.field_0._any.id - 0x100);
    if (uVar3 < (this_00->_labels).super_ZoneVectorBase._length) {
      le = *(LabelEntry **)((long)(this_00->_labels).super_ZoneVectorBase._data + uVar3 * 8);
    }
    else {
      le = (LabelEntry *)0x0;
    }
    if (le != (LabelEntry *)0x0) {
      bVar1 = (this->super_CodeEmitter)._codeInfo._archInfo.field_0.field_0._gpSize;
      uVar3 = (ulong)bVar1;
      if ((uVar3 <= (ulong)((long)this->_bufferEnd - (long)this->_bufferPtr)) ||
         (EVar2 = CodeHolder::growBuffer(this_00,&this->_section->_buffer,uVar3),
         in_XMM0_Da = extraout_XMM0_Da, EVar2 == 0)) {
        if (((this->super_CodeEmitter)._globalOptions & 4) != 0) {
          Logger::logf(((this->super_CodeEmitter)._code)->_logger,in_XMM0_Da);
        }
        EVar2 = CodeHolder::newRelocEntry((this->super_CodeEmitter)._code,&local_30,2,(uint)bVar1);
        if (EVar2 == 0) {
          sectionId = this->_section->_id;
          local_30->_sourceSectionId = sectionId;
          offset = (long)this->_bufferPtr - (long)this->_bufferData;
          local_30->_sourceOffset = offset;
          if (le->_sectionId == 0xffffffff) {
            pLVar4 = CodeHolder::newLabelLink((this->super_CodeEmitter)._code,le,sectionId,offset,0)
            ;
            if (pLVar4 == (LabelLink *)0x0) {
              EVar2 = CodeEmitter::setLastError(&this->super_CodeEmitter,1,(char *)0x0);
              return EVar2;
            }
            pLVar4->relocId = local_30->_id;
          }
          else {
            local_30->_targetSectionId = le->_sectionId;
            local_30->_data = le->_offset;
          }
          memset(this->_bufferPtr,0,uVar3);
          this->_bufferPtr = this->_bufferPtr + uVar3;
          return 0;
        }
      }
      goto LAB_0015a6b1;
    }
  }
  EVar2 = 0xc;
LAB_0015a6b1:
  EVar2 = CodeEmitter::setLastError(&this->super_CodeEmitter,EVar2,(char *)0x0);
  return EVar2;
}

Assistant:

Error Assembler::embedLabel(const Label& label) {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  RelocEntry* re;
  LabelEntry* le = _code->getLabelEntry(label);

  if (ASMJIT_UNLIKELY(!le))
    return setLastError(DebugUtils::errored(kErrorInvalidLabel));

  Error err;
  uint32_t gpSize = getGpSize();

  if (getRemainingSpace() < gpSize) {
    err = _code->growBuffer(&_section->_buffer, gpSize);
    if (ASMJIT_UNLIKELY(err)) return setLastError(err);
  }

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logf(gpSize == 4 ? ".dd L%u\n" : ".dq L%u\n", Operand::unpackId(label.getId()));
#endif // !ASMJIT_DISABLE_LOGGING

  err = _code->newRelocEntry(&re, RelocEntry::kTypeRelToAbs, gpSize);
  if (ASMJIT_UNLIKELY(err)) return setLastError(err);

  re->_sourceSectionId = _section->getId();
  re->_sourceOffset = static_cast<uint64_t>(getOffset());

  if (le->isBound()) {
    re->_targetSectionId = le->getSectionId();
    re->_data = static_cast<uint64_t>(static_cast<int64_t>(le->getOffset()));
  }
  else {
    LabelLink* link = _code->newLabelLink(le, _section->getId(), getOffset(), 0);
    if (ASMJIT_UNLIKELY(!link))
      return setLastError(DebugUtils::errored(kErrorNoHeapMemory));
    link->relocId = re->getId();
  }

  // Emit dummy DWORD/QWORD depending on the address size.
  ::memset(_bufferPtr, 0, gpSize);
  _bufferPtr += gpSize;

  return kErrorOk;
}